

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexFeedbackCase::VertexFeedbackCase
          (VertexFeedbackCase *this,Context *context,char *name,char *description,DrawMethod method,
          PrimitiveType output)

{
  PrimitiveType output_local;
  DrawMethod method_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  VertexFeedbackCase *this_local;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__VertexFeedbackCase_032be0a0;
  this->m_method = method;
  this->m_output = output;
  this->m_elementBuf = 0;
  this->m_arrayBuf = 0;
  this->m_offsetBuf = 0;
  this->m_feedbackBuf = 0;
  this->m_indirectBuffer = 0;
  this->m_program = (ShaderProgram *)0x0;
  this->m_vao = (VertexArray *)0x0;
  return;
}

Assistant:

VertexFeedbackCase::VertexFeedbackCase (Context& context, const char* name, const char* description, DrawMethod method, PrimitiveType output)
	: TestCase			(context, name, description)
	, m_method			(method)
	, m_output			(output)
	, m_elementBuf		(0)
	, m_arrayBuf		(0)
	, m_offsetBuf		(0)
	, m_feedbackBuf		(0)
	, m_indirectBuffer	(0)
	, m_program			(DE_NULL)
	, m_vao				(DE_NULL)
{
	DE_ASSERT(method < METHOD_LAST);
	DE_ASSERT(output < PRIMITIVE_LAST);
}